

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

Instr * __thiscall
Lowerer::GenerateCompleteStFld
          (Lowerer *this,Instr *instr,bool emitFastPath,JnHelperMethod monoHelperAfterFastPath,
          JnHelperMethod polyHelperAfterFastPath,JnHelperMethod monoHelperWithoutFastPath,
          JnHelperMethod polyHelperWithoutFastPath,bool withPutFlags,PropertyOperationFlags flags)

{
  code *pcVar1;
  bool bVar2;
  BailOutKind BVar3;
  undefined4 *puVar4;
  Instr *pIVar5;
  LabelInstr **ppLVar6;
  JnHelperMethod helperMethod;
  LabelInstr **labelBailOut;
  PropertyOperationFlags flags_00;
  LabelInstr *local_48;
  RegOpnd *typeOpnd;
  LabelInstr *labelHelper;
  bool isHelper;
  
  bVar2 = IR::Instr::CallsAccessor(instr,(PropertySymOpnd *)0x0);
  if (((bVar2) && ((instr->field_0x38 & 0x10) != 0)) &&
     (BVar3 = IR::Instr::GetBailOutKind(instr),
     (BVar3 & ~(BailOutKindBits|BailOutIntOnly)) == BailOutOnImplicitCalls)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1c75,
                       "(kindMinusBits != IR::BailOutOnImplicitCalls && kindMinusBits != IR::BailOutOnImplicitCallsPreOp)"
                       ,
                       "kindMinusBits != IR::BailOutOnImplicitCalls && kindMinusBits != IR::BailOutOnImplicitCallsPreOp"
                      );
    if (!bVar2) goto LAB_0059bf6a;
    *puVar4 = 0;
  }
  pIVar5 = instr->m_prev;
  typeOpnd = (RegOpnd *)0x0;
  labelHelper._7_1_ = '\0';
  local_48 = (LabelInstr *)0x0;
  if (emitFastPath) {
    bVar2 = GenerateFastStFldForCustomProperty(this,instr,(LabelInstr **)&typeOpnd);
    if (bVar2) {
      if (typeOpnd == (RegOpnd *)0x0) {
        IR::Instr::Remove(instr);
        return pIVar5;
      }
      if ((typeOpnd[3].field_0x18 & 2) == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x1c82,"(labelHelper->isOpHelper)","labelHelper->isOpHelper");
        if (!bVar2) goto LAB_0059bf6a;
        *puVar4 = 0;
      }
      IR::Instr::InsertBefore(instr,(Instr *)typeOpnd);
LAB_0059bf30:
      pIVar5 = LowerStFld(this,instr,monoHelperWithoutFastPath,polyHelperWithoutFastPath,true,
                          (LabelInstr *)0x0,(bool)labelHelper._7_1_,withPutFlags,flags);
      return pIVar5;
    }
    labelBailOut = &local_48;
    flags_00 = 0x59be74;
    ppLVar6 = (LabelInstr **)&typeOpnd;
    bVar2 = GenerateStFldWithCachedType
                      (this,instr,(bool *)((long)&labelHelper + 7),(LabelInstr **)&typeOpnd,
                       (RegOpnd **)labelBailOut);
    if (!bVar2) {
      GenerateFastStFld(this,instr,helperMethod,(JnHelperMethod)ppLVar6,labelBailOut,
                        (RegOpnd *)local_48,(bool *)((long)&labelHelper + 7),
                        (LabelInstr **)&typeOpnd,false,flags_00);
      monoHelperWithoutFastPath = monoHelperAfterFastPath;
      polyHelperWithoutFastPath = polyHelperAfterFastPath;
      if (typeOpnd != (RegOpnd *)0x0) {
        typeOpnd[3].field_0x18 = typeOpnd[3].field_0x18 & 0xfd | labelHelper._7_1_ * '\x02';
        IR::Instr::InsertBefore(instr,(Instr *)typeOpnd);
      }
      goto LAB_0059bf30;
    }
  }
  else {
    bVar2 = GenerateStFldWithCachedType
                      (this,instr,(bool *)((long)&labelHelper + 7),(LabelInstr **)&typeOpnd,
                       (RegOpnd **)&local_48);
    if (!bVar2) {
      polyHelperWithoutFastPath = monoHelperWithoutFastPath;
      if (typeOpnd != (RegOpnd *)0x0) {
        typeOpnd[3].field_0x18 = typeOpnd[3].field_0x18 & 0xfd | labelHelper._7_1_ * '\x02';
        IR::Instr::InsertBefore(instr,(Instr *)typeOpnd);
      }
      goto LAB_0059bf30;
    }
  }
  if (typeOpnd == (RegOpnd *)0x0) {
    return pIVar5;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar4 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                     ,0x1c8e,"(labelHelper == nullptr)","labelHelper == nullptr");
  if (bVar2) {
    *puVar4 = 0;
    return pIVar5;
  }
LAB_0059bf6a:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

IR::Instr* Lowerer::GenerateCompleteStFld(IR::Instr* instr, bool emitFastPath, IR::JnHelperMethod monoHelperAfterFastPath, IR::JnHelperMethod polyHelperAfterFastPath,
    IR::JnHelperMethod monoHelperWithoutFastPath, IR::JnHelperMethod polyHelperWithoutFastPath, bool withPutFlags, Js::PropertyOperationFlags flags)
{
    if(instr->CallsAccessor() && instr->HasBailOutInfo())
    {
        IR::BailOutKind kindMinusBits = instr->GetBailOutKind() & ~IR::BailOutKindBits;
        Assert(kindMinusBits != IR::BailOutOnImplicitCalls && kindMinusBits != IR::BailOutOnImplicitCallsPreOp);
    }

    IR::Instr* prevInstr = instr->m_prev;

    IR::LabelInstr* labelBailOut = nullptr;
    IR::LabelInstr* labelHelper = nullptr;
    bool isHelper = false;
    IR::RegOpnd* typeOpnd = nullptr;
    if(emitFastPath && GenerateFastStFldForCustomProperty(instr, &labelHelper))
    {
        if(labelHelper)
        {
            Assert(labelHelper->isOpHelper);
            instr->InsertBefore(labelHelper);
            prevInstr = this->LowerStFld(instr, monoHelperWithoutFastPath, polyHelperWithoutFastPath, true, labelBailOut, isHelper, withPutFlags, flags);
        }
        else
        {
            instr->Remove();
            return prevInstr;
        }
    }
    else if (this->GenerateStFldWithCachedType(instr, &isHelper, &labelHelper, &typeOpnd))
    {
        Assert(labelHelper == nullptr);
        return prevInstr;
    }
    else if (emitFastPath)
    {
        if (!GenerateFastStFld(instr, monoHelperWithoutFastPath, polyHelperWithoutFastPath, &labelBailOut, typeOpnd, &isHelper, &labelHelper, withPutFlags, flags))
        {
            if (labelHelper != nullptr)
            {
                labelHelper->isOpHelper = isHelper;
                instr->InsertBefore(labelHelper);
            }
            prevInstr = this->LowerStFld(instr, monoHelperAfterFastPath, polyHelperAfterFastPath, true, labelBailOut, isHelper, withPutFlags, flags);
        }
    }
    else
    {
        if (labelHelper != nullptr)
        {
            labelHelper->isOpHelper = isHelper;
            instr->InsertBefore(labelHelper);
        }
        prevInstr = this->LowerStFld(instr, monoHelperWithoutFastPath, monoHelperWithoutFastPath, true, labelBailOut, isHelper, withPutFlags, flags);
    }

    return prevInstr;
}